

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O1

RK_U32 mpp_slots_is_empty(MppBufSlots slots,SlotQueueType type)

{
  pthread_mutex_t *__mutex;
  long *plVar1;
  bool bVar2;
  
  if (slots == (MppBufSlots)0x0) {
    bVar2 = false;
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_slots_is_empty");
  }
  else {
    __mutex = *slots;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    plVar1 = (long *)((long)slots + (ulong)type * 0x10 + 0xa0);
    bVar2 = (long *)*plVar1 == plVar1;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return (RK_U32)bVar2;
}

Assistant:

RK_U32 mpp_slots_is_empty(MppBufSlots slots, SlotQueueType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return 0;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    return list_empty(&impl->queue[type]) ? 1 : 0;
}